

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O0

Aig_Obj_t * Saig_ManAbstractionDfs_rec(Aig_Man_t *pNew,Aig_Obj_t *pObj)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *p1;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pNew_local;
  
  if ((pObj->field_5).pData == (void *)0x0) {
    pAVar1 = Aig_ObjFanin0(pObj);
    Saig_ManAbstractionDfs_rec(pNew,pAVar1);
    pAVar1 = Aig_ObjFanin1(pObj);
    Saig_ManAbstractionDfs_rec(pNew,pAVar1);
    pAVar1 = Aig_ObjChild0Copy(pObj);
    p1 = Aig_ObjChild1Copy(pObj);
    pNew_local = (Aig_Man_t *)Aig_And(pNew,pAVar1,p1);
    (pObj->field_5).pData = pNew_local;
  }
  else {
    pNew_local = (Aig_Man_t *)(pObj->field_5).pData;
  }
  return (Aig_Obj_t *)pNew_local;
}

Assistant:

Aig_Obj_t * Saig_ManAbstractionDfs_rec( Aig_Man_t * pNew, Aig_Obj_t * pObj )
{
    if ( pObj->pData )
        return (Aig_Obj_t *)pObj->pData;
    Saig_ManAbstractionDfs_rec( pNew, Aig_ObjFanin0(pObj) );
    Saig_ManAbstractionDfs_rec( pNew, Aig_ObjFanin1(pObj) );
    return (Aig_Obj_t *)(pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) ));
}